

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::SmokeTest::prepareDstPxls
          (SmokeTest *this,testCase *test_case,GLubyte **out_pixels)

{
  GLenum internal_format;
  GLenum type;
  GLuint GVar1;
  GLubyte *__s;
  ulong __n;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  internal_format = test_case->m_internal_format;
  lVar2 = 0x100;
  if (test_case->m_target == 0x9009) {
    lVar2 = 0x600;
  }
  GVar1 = Utils::getPixelSizeForFormat(internal_format);
  __n = (ulong)((int)lVar2 * GVar1);
  type = test_case->m_type;
  __s = (GLubyte *)operator_new__(__n);
  *out_pixels = __s;
  lVar3 = 0;
  memset(__s,0,__n);
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    Utils::packPixel(internal_format,type,1.0,1.0,1.0,1.0,*out_pixels + lVar3);
    lVar3 = lVar3 + (ulong)GVar1;
  }
  return;
}

Assistant:

void SmokeTest::prepareDstPxls(const SmokeTest::testCase& test_case, GLubyte*& out_pixels) const
{
	static const GLuint n_pixels_per_layer = m_width * m_height;

	const GLenum internal_format = test_case.m_internal_format;
	const GLuint n_layers		 = (GL_TEXTURE_CUBE_MAP_ARRAY != test_case.m_target) ? m_depth : 6;
	const GLuint n_pixels		 = n_pixels_per_layer * n_layers;
	const GLuint pixel_size		 = Utils::getPixelSizeForFormat(internal_format);
	const GLuint req_memory		 = pixel_size * n_pixels;
	const GLenum type			 = test_case.m_type;

	/* Prepare storage */
	out_pixels = new GLubyte[req_memory];

	if (0 == out_pixels)
	{
		TCU_FAIL("Memory allocation failed");
	}

	memset(out_pixels, 0, req_memory);

	/* Fill pixels */
	for (GLuint j = 0; j < n_pixels; ++j)
	{
		GLubyte* pixel_data = out_pixels + j * pixel_size;

		Utils::packPixel(internal_format, type, 1.0, 1.0, 1.0, 1.0, pixel_data);
	}
}